

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.h
# Opt level: O0

uint32_t __thiscall spvtools::opt::analysis::TypeManager::GetVoidTypeId(TypeManager *this)

{
  uint32_t uVar1;
  Type *type;
  TypeManager *this_local;
  
  type = GetVoidType(this);
  uVar1 = GetTypeInstruction(this,type);
  return uVar1;
}

Assistant:

uint32_t GetVoidTypeId() { return GetTypeInstruction(GetVoidType()); }